

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

http_request_method parse_request_method(sub_string *text)

{
  bool bVar1;
  size_t sVar2;
  http_parsing_error *phVar3;
  char *pcVar4;
  sub_string sVar5;
  sub_string *text_local;
  
  bVar1 = sub_string::empty(text);
  if (bVar1) {
    phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(phVar3,"empty request-line");
    __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
  }
  sVar2 = sub_string::size(text);
  if (sVar2 < 3) {
    phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(phVar3,"invalid request method");
    __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
  }
  pcVar4 = sub_string::operator[](text,0);
  switch(*pcVar4) {
  case 'C':
    sVar5 = sub_string::literal<8ul>((char (*) [8])"CONNECT");
    bVar1 = sub_string::try_drop_prefix(text,sVar5);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
      http_parsing_error::http_parsing_error(phVar3,"invalid request method");
      __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
    }
    text_local._4_4_ = CONNECT;
    break;
  case 'D':
    sVar5 = sub_string::literal<7ul>((char (*) [7])"DELETE");
    bVar1 = sub_string::try_drop_prefix(text,sVar5);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
      http_parsing_error::http_parsing_error(phVar3,"invalid request method");
      __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
    }
    text_local._4_4_ = DELETE;
    break;
  default:
    phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(phVar3,"invalid request method");
    __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
  case 'G':
    sVar5 = sub_string::literal<4ul>((char (*) [4])0x18703e);
    bVar1 = sub_string::try_drop_prefix(text,sVar5);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
      http_parsing_error::http_parsing_error(phVar3,"invalid request method");
      __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
    }
    text_local._4_4_ = GET;
    break;
  case 'H':
    sVar5 = sub_string::literal<5ul>((char (*) [5])"HEAD");
    bVar1 = sub_string::try_drop_prefix(text,sVar5);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
      http_parsing_error::http_parsing_error(phVar3,"invalid request method");
      __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
    }
    text_local._4_4_ = HEAD;
    break;
  case 'O':
    sVar5 = sub_string::literal<8ul>((char (*) [8])0x18730a);
    bVar1 = sub_string::try_drop_prefix(text,sVar5);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
      http_parsing_error::http_parsing_error(phVar3,"invalid request method");
      __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
    }
    text_local._4_4_ = OPTIONS;
    break;
  case 'P':
    pcVar4 = sub_string::operator[](text,1);
    if (*pcVar4 == 'O') {
      sVar5 = sub_string::literal<5ul>((char (*) [5])0x1870e3);
      bVar1 = sub_string::try_drop_prefix(text,sVar5);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
        http_parsing_error::http_parsing_error(phVar3,"invalid request method");
        __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
      }
      text_local._4_4_ = POST;
    }
    else {
      if (*pcVar4 != 'U') {
        phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
        http_parsing_error::http_parsing_error(phVar3,"invalid request method");
        __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
      }
      sVar5 = sub_string::literal<4ul>((char (*) [4])0x187106);
      bVar1 = sub_string::try_drop_prefix(text,sVar5);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
        http_parsing_error::http_parsing_error(phVar3,"invalid request method");
        __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
      }
      text_local._4_4_ = PUT;
    }
    break;
  case 'T':
    sVar5 = sub_string::literal<6ul>((char (*) [6])"TRACE");
    bVar1 = sub_string::try_drop_prefix(text,sVar5);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      phVar3 = (http_parsing_error *)__cxa_allocate_exception(0x10);
      http_parsing_error::http_parsing_error(phVar3,"invalid request method");
      __cxa_throw(phVar3,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
    }
    text_local._4_4_ = TRACE;
  }
  return text_local._4_4_;
}

Assistant:

http_request_method parse_request_method(sub_string& text)
{
    if (text.empty())
        throw http_parsing_error("empty request-line");

    if (text.size() < 3)
        throw http_parsing_error("invalid request method");

    switch (text[0])
    {
    case 'O':
        if (!text.try_drop_prefix(sub_string::literal("OPTIONS")))
            throw http_parsing_error("invalid request method");
        return http_request_method::OPTIONS;
    case 'G':
        if (!text.try_drop_prefix(sub_string::literal("GET")))
            throw http_parsing_error("invalid request method");
        return http_request_method::GET;
    case 'H':
        if (!text.try_drop_prefix(sub_string::literal("HEAD")))
            throw http_parsing_error("invalid request method");
        return http_request_method::HEAD;
    case 'P':
        switch (text[1])
        {
        case 'U':
            if (!text.try_drop_prefix(sub_string::literal("PUT")))
                throw http_parsing_error("invalid request method");
            return http_request_method::PUT;
        case 'O':
            if (!text.try_drop_prefix(sub_string::literal("POST")))
                throw http_parsing_error("invalid request method");
            return http_request_method::POST;
        default:
            throw http_parsing_error("invalid request method");
        }
    case 'D':
        if (!text.try_drop_prefix(sub_string::literal("DELETE")))
            throw http_parsing_error("invalid request method");
        return http_request_method::DELETE;
    case 'T':
        if (!text.try_drop_prefix(sub_string::literal("TRACE")))
            throw http_parsing_error("invalid request method");
        return http_request_method::TRACE;
    case 'C':
        if (!text.try_drop_prefix(sub_string::literal("CONNECT")))
            throw http_parsing_error("invalid request method");
        return http_request_method::CONNECT;
    default:
        throw http_parsing_error("invalid request method");
    }
}